

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

int __thiscall
spdlog::pattern_formatter::clone
          (pattern_formatter *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  custom_flag_formatter *pcVar1;
  undefined1 auVar2 [8];
  mapped_type *pmVar3;
  pointer *__ptr;
  long *plVar4;
  custom_flags cloned_custom_formatters;
  undefined1 local_68 [8];
  undefined1 local_60 [24];
  size_type sStack_48;
  float local_40;
  size_t local_38;
  __node_base_ptr p_Stack_30;
  
  local_60._0_8_ = &p_Stack_30;
  local_60._8_8_ = 1;
  local_60._16_8_ = 0;
  sStack_48 = 0;
  local_40 = 1.0;
  local_38 = 0;
  p_Stack_30 = (__node_base_ptr)0x0;
  plVar4 = *(long **)(__fn + 0xb8);
  if (plVar4 != (long *)0x0) {
    do {
      (**(code **)(*(long *)plVar4[2] + 0x18))(local_68);
      pmVar3 = std::__detail::
               _Map_base<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_60,(key_type *)(plVar4 + 1));
      auVar2 = local_68;
      local_68 = (undefined1  [8])0x0;
      pcVar1 = (pmVar3->_M_t).
               super___uniq_ptr_impl<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
               ._M_t.
               super__Tuple_impl<0UL,_spdlog::custom_flag_formatter_*,_std::default_delete<spdlog::custom_flag_formatter>_>
               .super__Head_base<0UL,_spdlog::custom_flag_formatter_*,_false>._M_head_impl;
      (pmVar3->_M_t).
      super___uniq_ptr_impl<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>
      ._M_t.
      super__Tuple_impl<0UL,_spdlog::custom_flag_formatter_*,_std::default_delete<spdlog::custom_flag_formatter>_>
      .super__Head_base<0UL,_spdlog::custom_flag_formatter_*,_false>._M_head_impl =
           (custom_flag_formatter *)auVar2;
      if (pcVar1 != (custom_flag_formatter *)0x0) {
        (**(code **)(*(long *)pcVar1 + 8))();
      }
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
      plVar4 = (long *)*plVar4;
    } while (plVar4 != (long *)0x0);
  }
  std::
  make_unique<spdlog::pattern_formatter,std::__cxx11::string_const&,spdlog::pattern_time_type_const&,std::__cxx11::string_const&,std::unordered_map<char,std::unique_ptr<spdlog::custom_flag_formatter,std::default_delete<spdlog::custom_flag_formatter>>,std::hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::unique_ptr<spdlog::custom_flag_formatter,std::default_delete<spdlog::custom_flag_formatter>>>>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (pattern_time_type *)(__fn + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__fn + 0x48),
             (unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
              *)(__fn + 0x28));
  auVar2 = local_68;
  local_68 = (undefined1  [8])0x0;
  (this->super_formatter)._vptr_formatter = (_func_int **)auVar2;
  std::
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_60);
  return (int)this;
}

Assistant:

SPDLOG_INLINE std::unique_ptr<formatter> pattern_formatter::clone() const
{
    custom_flags cloned_custom_formatters;
    for (auto &it : custom_handlers_)
    {
        cloned_custom_formatters[it.first] = it.second->clone();
    }
    return details::make_unique<pattern_formatter>(pattern_, pattern_time_type_, eol_, std::move(cloned_custom_formatters));
}